

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-softmaxes.cc
# Opt level: O0

void __thiscall
dynet::SparsemaxLoss::forward_dev_impl<dynet::Device_CPU>
          (SparsemaxLoss *this,Device_CPU *dev,
          vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *xs,Tensor *fx)

{
  float *pfVar1;
  uint uVar2;
  const_reference ppTVar3;
  runtime_error *prVar4;
  size_type sVar5;
  vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *in_RDX;
  long in_RDI;
  ostringstream oss_1;
  uint i;
  Tensor tsm;
  float tau;
  float t;
  int k;
  float maxsum;
  float sum;
  float *zs;
  float qprop;
  uint qsupport_size;
  ostringstream oss;
  int rows;
  TensorCwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_0,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_product_op<float,_float>_>,_const_Eigen::TensorChippingOp<0L,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>_>
  *in_stack_fffffffffffff818;
  Tensor *in_stack_fffffffffffff820;
  Device *in_stack_fffffffffffff828;
  ostringstream *this_00;
  value_type this_01;
  Dim *d;
  undefined4 in_stack_fffffffffffff840;
  Scalar threshold;
  TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_0> *this_02;
  TensorBase<Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_difference_op<float,_float>_>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>,_0>
  *this_03;
  TensorBase<Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_cmp_op<float,_float,_(Eigen::internal::ComparisonName)4>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>,_0>
  *this_04;
  string local_738 [32];
  ostringstream local_718 [376];
  TensorMap<Eigen::Tensor<float,_0,_0,_long>,_0,_Eigen::MakePointer> *local_5a0;
  TensorMap<Eigen::Tensor<float,_0,_0,_long>,_0,_Eigen::MakePointer> *local_590;
  TensorMap<Eigen::Tensor<float,_0,_0,_long>,_0,_Eigen::MakePointer> *local_550;
  TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> local_540;
  TensorMap<Eigen::Tensor<float,_0,_0,_long>,_0,_Eigen::MakePointer> *local_4e8;
  uint local_494;
  TensorMap<Eigen::Tensor<float,_0,_0,_long>,_0,_Eigen::MakePointer> *local_490;
  TensorMap<Eigen::Tensor<float,_0,_0,_long>,_0,_Eigen::MakePointer> *local_480;
  TensorMap<Eigen::Tensor<float,_0,_0,_long>,_0,_Eigen::MakePointer> *local_438;
  TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> local_428;
  TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> local_3e0;
  TensorBase<Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_cmp_op<float,_float,_(Eigen::internal::ComparisonName)4>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>,_0>
  local_3d0 [280];
  TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> local_2b8;
  TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> local_2a8;
  TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_0>
  local_298 [24];
  undefined1 local_280 [64];
  TensorBase<Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_difference_op<float,_float>_>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>,_0>
  local_240 [64];
  float local_200;
  float local_1fc;
  int local_1f8;
  float local_1f4;
  float local_1f0;
  long local_1e8;
  float local_1dc;
  uint local_1d8;
  undefined1 local_1d1;
  string local_1d0 [48];
  ostringstream local_1a0 [380];
  uint local_24;
  vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *local_18;
  
  local_18 = in_RDX;
  ppTVar3 = std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::operator[]
                      (in_RDX,0);
  uVar2 = Dim::cols(&(*ppTVar3)->d);
  if (uVar2 != 1) {
    this_00 = local_718;
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,"SparsemaxLoss not yet implemented for multiple columns");
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_738);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  ppTVar3 = std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::operator[]
                      (local_18,0);
  local_24 = Dim::rows(&(*ppTVar3)->d);
  if (0x10000 < (int)local_24) {
    std::__cxx11::ostringstream::ostringstream(local_1a0);
    std::operator<<((ostream *)local_1a0,
                    "MAX_SPARSEMAX_LOSS_ROWS is not sufficient. Recompile with larger value.");
    local_1d1 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_1d0);
    local_1d1 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)(in_RDI + 0x78));
  local_1d8 = (uint)sVar5;
  local_1dc = 1.0 / (float)(sVar5 & 0xffffffff);
  local_1e8 = *(long *)(in_RDI + 0x58);
  ppTVar3 = std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::operator[]
                      (local_18,0);
  pfVar1 = (*ppTVar3)->v;
  ppTVar3 = std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::operator[]
                      (local_18,0);
  std::partial_sort_copy<float*,float*,std::greater<float>>
            (pfVar1,(*ppTVar3)->v + (int)local_24,local_1e8,local_1e8 + (long)(int)local_24 * 4);
  local_1f0 = 0.0;
  for (local_1f8 = 0; local_1f4 = local_1f0, local_1f8 < (int)local_24; local_1f8 = local_1f8 + 1) {
    local_1f0 = *(float *)(local_1e8 + (long)local_1f8 * 4) + local_1f0;
    local_1fc = (float)(local_1f8 + 1) * *(float *)(local_1e8 + (long)local_1f8 * 4) + 1.0;
    if (local_1fc <= local_1f0) break;
  }
  local_200 = (local_1f4 + -1.0) / (float)local_1f8;
  threshold = 0.0;
  ppTVar3 = std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::operator[]
                      (local_18,0);
  this_01 = *ppTVar3;
  d = *(Dim **)(in_RDI + 0x58);
  std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::operator[](local_18,0)
  ;
  this_03 = local_240;
  Tensor::Tensor((Tensor *)CONCAT44(threshold,in_stack_fffffffffffff840),d,(float *)this_01,
                 in_stack_fffffffffffff828,(DeviceMempool)((ulong)in_stack_fffffffffffff820 >> 0x20)
                );
  std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::operator[](local_18,0)
  ;
  local_2a8 = Tensor::t<1>(in_stack_fffffffffffff820);
  this_02 = local_298;
  Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_0>::
  operator-((TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_0>
             *)d,(Scalar)((ulong)this_01 >> 0x20));
  Eigen::
  TensorBase<Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_difference_op<float,_float>_>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>,_0>
  ::cwiseMax<0>(this_03,(Scalar)((ulong)local_280 >> 0x20));
  local_2b8 = Tensor::t<1>(in_stack_fffffffffffff820);
  Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>::operator=
            ((TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> *)
             in_stack_fffffffffffff820,
             (TensorCwiseBinaryOp<Eigen::internal::scalar_max_op<float,_float,_0>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_difference_op<float,_float>_>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>,_const_Eigen::TensorCwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_difference_op<float,_float>_>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>_>
              *)in_stack_fffffffffffff818);
  local_3e0 = Tensor::t<1>(in_stack_fffffffffffff820);
  this_04 = local_3d0;
  Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_0>::
  operator!=(this_02,threshold);
  Eigen::
  TensorBase<Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_cmp_op<float,_float,_(Eigen::internal::ComparisonName)4>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>,_0>
  ::cast<float>(this_04);
  std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::operator[](local_18,0)
  ;
  local_428 = Tensor::t<1>(in_stack_fffffffffffff820);
  Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_0>::
  square((TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_0> *
         )d);
  Eigen::
  TensorBase<Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_square_op<float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>,_0>
  ::operator-((TensorBase<Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_square_op<float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>,_0>
               *)d,(Scalar)((ulong)this_01 >> 0x20));
  Eigen::
  TensorBase<Eigen::TensorConversionOp<float,Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_cmp_op<float,float,(Eigen::internal::ComparisonName)4>,Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>const,Eigen::TensorCwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>const>const>const>,0>
  ::operator*((TensorBase<Eigen::TensorConversionOp<float,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_cmp_op<float,_float,_(Eigen::internal::ComparisonName)4>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>_>,_0>
               *)this_02,
              (TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_difference_op<float,_float>_>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_square_op<float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>
               *)CONCAT44(threshold,in_stack_fffffffffffff840));
  Eigen::
  TensorBase<Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::TensorConversionOp<float,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_cmp_op<float,_float,_(Eigen::internal::ComparisonName)4>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>_>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_difference_op<float,_float>_>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_square_op<float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>_>,_0>
  ::sum((TensorBase<Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::TensorConversionOp<float,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_cmp_op<float,_float,_(Eigen::internal::ComparisonName)4>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>_>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_difference_op<float,_float>_>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_square_op<float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>_>,_0>
         *)in_stack_fffffffffffff828);
  local_438 = Tensor::t<0>((Tensor *)0xd3cfca);
  Eigen::TensorMap<Eigen::Tensor<float,0,0,long>,0,Eigen::MakePointer>::operator=
            ((TensorMap<Eigen::Tensor<float,_0,_0,_long>,_0,_Eigen::MakePointer> *)
             in_stack_fffffffffffff820,
             (TensorReductionOp<Eigen::internal::SumReducer<float>,_const_Eigen::DimensionList<long,_1UL>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::TensorConversionOp<float,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_cmp_op<float,_float,_(Eigen::internal::ComparisonName)4>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>_>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_difference_op<float,_float>_>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_square_op<float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>_>,_Eigen::MakePointer>
              *)in_stack_fffffffffffff818);
  local_480 = Tensor::t<0>((Tensor *)0xd3cff4);
  Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_0,_0,_long>,_0,_Eigen::MakePointer>,_0>::
  operator+((TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_0,_0,_long>,_0,_Eigen::MakePointer>,_0>
             *)d,(Scalar)((ulong)this_01 >> 0x20));
  Eigen::
  TensorBase<Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_sum_op<float,_float>_>,_const_Eigen::TensorMap<Eigen::Tensor<float,_0,_0,_long>,_0,_Eigen::MakePointer>_>,_0>
  ::operator/((TensorBase<Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_sum_op<float,_float>_>,_const_Eigen::TensorMap<Eigen::Tensor<float,_0,_0,_long>,_0,_Eigen::MakePointer>_>,_0>
               *)d,(Scalar)((ulong)this_01 >> 0x20));
  local_490 = Tensor::t<0>((Tensor *)0xd3d058);
  Eigen::TensorMap<Eigen::Tensor<float,0,0,long>,0,Eigen::MakePointer>::operator=
            ((TensorMap<Eigen::Tensor<float,_0,_0,_long>,_0,_Eigen::MakePointer> *)
             in_stack_fffffffffffff820,
             (TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_quotient_op<float,_float>_>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_sum_op<float,_float>_>,_const_Eigen::TensorMap<Eigen::Tensor<float,_0,_0,_long>,_0,_Eigen::MakePointer>_>_>
              *)in_stack_fffffffffffff818);
  for (local_494 = 0; local_494 < local_1d8; local_494 = local_494 + 1) {
    local_4e8 = Tensor::t<0>((Tensor *)0xd3d0a1);
    std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::operator[]
              (local_18,0);
    local_540 = Tensor::t<1>(in_stack_fffffffffffff820);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)(in_RDI + 0x78),
               (ulong)local_494);
    Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>,1>::
    chip<0l>((TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_1>
              *)this_01,(Index)in_stack_fffffffffffff828);
    Eigen::
    TensorBase<Eigen::TensorChippingOp<0L,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>,_0>
    ::operator*((TensorBase<Eigen::TensorChippingOp<0L,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>,_0>
                 *)d,(Scalar)((ulong)this_01 >> 0x20));
    Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,0,0,long>,0,Eigen::MakePointer>,0>::
    operator-((TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_0,_0,_long>,_0,_Eigen::MakePointer>,_0>
               *)this_02,
              (TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_product_op<float,_float>_>,_const_Eigen::TensorChippingOp<0L,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>
               *)CONCAT44(threshold,in_stack_fffffffffffff840));
    local_550 = Tensor::t<0>((Tensor *)0xd3d150);
    Eigen::TensorMap<Eigen::Tensor<float,0,0,long>,0,Eigen::MakePointer>::operator=
              ((TensorMap<Eigen::Tensor<float,_0,_0,_long>,_0,_Eigen::MakePointer> *)
               in_stack_fffffffffffff820,in_stack_fffffffffffff818);
  }
  local_590 = Tensor::t<0>((Tensor *)0xd3d190);
  Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_0,_0,_long>,_0,_Eigen::MakePointer>,_0>::
  cwiseMax<0>((TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_0,_0,_long>,_0,_Eigen::MakePointer>,_0>
               *)this_02,threshold);
  local_5a0 = Tensor::t<0>((Tensor *)0xd3d1bd);
  Eigen::TensorMap<Eigen::Tensor<float,0,0,long>,0,Eigen::MakePointer>::operator=
            ((TensorMap<Eigen::Tensor<float,_0,_0,_long>,_0,_Eigen::MakePointer> *)
             in_stack_fffffffffffff820,
             (TensorCwiseBinaryOp<Eigen::internal::scalar_max_op<float,_float,_0>,_const_Eigen::TensorMap<Eigen::Tensor<float,_0,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_0,_0,_long>,_0,_Eigen::MakePointer>_>_>
              *)in_stack_fffffffffffff818);
  return;
}

Assistant:

void SparsemaxLoss::forward_dev_impl(const MyDevice & dev, const vector<const Tensor*>& xs, Tensor& fx) const {
  if (xs[0]->d.cols() == 1) {
#ifdef __CUDACC__
    DYNET_NO_CUDA_IMPL_ERROR("SparsemaxLoss forward");
#else
    const int rows = xs[0]->d.rows();
    if (rows > MAX_SPARSEMAX_LOSS_ROWS)
      DYNET_RUNTIME_ERR("MAX_SPARSEMAX_LOSS_ROWS is not sufficient. Recompile with larger value.");
    const unsigned qsupport_size = pq->size();
    const float qprop = 1.f / qsupport_size;

    float *zs = static_cast<float*>(aux_mem);
    std::partial_sort_copy(xs[0]->v, xs[0]->v+rows, zs, zs + rows, std::greater<float>());
    float sum = 0, maxsum = 0;
    int k = 0;
    for (k = 0; k < rows; ++k) {
      sum += zs[k];
      float t = 1 + (k + 1) * zs[k];
      if (t <= sum) break;
      maxsum = sum;
    }
    float tau = (maxsum - 1) / k;
    Tensor tsm(xs[0]->d, (float*)aux_mem, xs[0]->device, DeviceMempool::FXS);
    tsm.t<1>() = (xs[0]->t<1>() - tau).cwiseMax(0.f);
    fx.t<0>() = ( (tsm.t<1>() != 0.f).cast<float>() * (xs[0]->t<1>().square() - (tau * tau)) ).sum();
    fx.t<0>() = ( fx.t<0>() + qprop * qprop * qsupport_size ) / 2.f;
    for (unsigned i = 0; i < qsupport_size; ++i)
      fx.t<0>() = fx.t<0>() - xs[0]->t<1>().chip<0>((*pq)[i]) * qprop;
    fx.t<0>() = fx.t<0>().cwiseMax(0.f);
#endif
  } else {
    DYNET_RUNTIME_ERR("SparsemaxLoss not yet implemented for multiple columns");
  }
}